

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

void http2_data_done(Curl_cfilter *cf,Curl_easy *data,_Bool premature)

{
  int32_t stream_id;
  HTTP *pHVar1;
  int32_t *piVar2;
  undefined8 *puVar3;
  nghttp2_session *session;
  _Bool _Var4;
  size_t size;
  long lVar5;
  int stream_id_00;
  void *pvVar6;
  
  if (data == (Curl_easy *)0x0) {
    return;
  }
  pHVar1 = (data->req).p.http;
  if (pHVar1 == (HTTP *)0x0) {
    return;
  }
  piVar2 = (int32_t *)pHVar1->h2_ctx;
  if (piVar2 == (int32_t *)0x0) {
    return;
  }
  puVar3 = (undefined8 *)cf->ctx;
  if ((nghttp2_session *)*puVar3 == (nghttp2_session *)0x0) goto LAB_006a1cd1;
  nghttp2_session_set_stream_user_data((nghttp2_session *)*puVar3,*piVar2,(void *)0x0);
  if ((*(char *)((long)piVar2 + 0x14d) == '\0') && (stream_id_00 = *piVar2, 0 < stream_id_00)) {
    if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[%d] premature DATA_DONE, RST stream");
      stream_id_00 = *piVar2;
    }
    *(undefined2 *)((long)piVar2 + 0x14d) = 0x101;
    *(undefined1 *)((long)piVar2 + 0x151) = 1;
    nghttp2_submit_rst_stream((nghttp2_session *)*puVar3,'\0',stream_id_00,5);
    _Var4 = Curl_bufq_is_empty((bufq *)(piVar2 + 2));
    if (!_Var4) goto LAB_006a1cac;
  }
  else {
    _Var4 = Curl_bufq_is_empty((bufq *)(piVar2 + 2));
    if (_Var4) goto LAB_006a1cd1;
LAB_006a1cac:
    session = (nghttp2_session *)*puVar3;
    stream_id = *piVar2;
    size = Curl_bufq_len((bufq *)(piVar2 + 2));
    nghttp2_session_consume(session,stream_id,size);
  }
  nghttp2_session_send((nghttp2_session *)*puVar3);
LAB_006a1cd1:
  Curl_bufq_free((bufq *)(piVar2 + 0x12));
  Curl_bufq_free((bufq *)(piVar2 + 2));
  Curl_h1_req_parse_free((h1_req_parser *)(piVar2 + 0x22));
  Curl_dynhds_free((dynhds *)(piVar2 + 0x36));
  pvVar6 = *(void **)(piVar2 + 0x4a);
  if (pvVar6 != (void *)0x0) {
    lVar5 = *(long *)(piVar2 + 0x4c);
    if (lVar5 != 0) {
      do {
        (*Curl_cfree)(*(void **)(*(long *)(piVar2 + 0x4a) + -8 + lVar5 * 8));
        lVar5 = *(long *)(piVar2 + 0x4c) + -1;
        *(long *)(piVar2 + 0x4c) = lVar5;
      } while (lVar5 != 0);
      pvVar6 = *(void **)(piVar2 + 0x4a);
    }
    (*Curl_cfree)(pvVar6);
    piVar2[0x4a] = 0;
    piVar2[0x4b] = 0;
  }
  (*Curl_cfree)(piVar2);
  ((data->req).p.http)->h2_ctx = (void *)0x0;
  return;
}

Assistant:

static void http2_data_done(struct Curl_cfilter *cf,
                            struct Curl_easy *data, bool premature)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  DEBUGASSERT(ctx);
  (void)premature;
  if(!stream)
    return;

  if(ctx->h2) {
    bool flush_egress = FALSE;
    /* returns error if stream not known, which is fine here */
    (void)nghttp2_session_set_stream_user_data(ctx->h2, stream->id, NULL);

    if(!stream->closed && stream->id > 0) {
      /* RST_STREAM */
      CURL_TRC_CF(data, cf, "[%d] premature DATA_DONE, RST stream",
                  stream->id);
      stream->closed = TRUE;
      stream->reset = TRUE;
      stream->send_closed = TRUE;
      nghttp2_submit_rst_stream(ctx->h2, NGHTTP2_FLAG_NONE,
                                stream->id, NGHTTP2_STREAM_CLOSED);
      flush_egress = TRUE;
    }
    if(!Curl_bufq_is_empty(&stream->recvbuf)) {
      /* Anything in the recvbuf is still being counted
       * in stream and connection window flow control. Need
       * to free that space or the connection window might get
       * exhausted eventually. */
      nghttp2_session_consume(ctx->h2, stream->id,
                              Curl_bufq_len(&stream->recvbuf));
      /* give WINDOW_UPATE a chance to be sent, but ignore any error */
      flush_egress = TRUE;
    }

    if(flush_egress)
      nghttp2_session_send(ctx->h2);
  }

  Curl_bufq_free(&stream->sendbuf);
  Curl_bufq_free(&stream->recvbuf);
  Curl_h1_req_parse_free(&stream->h1);
  Curl_dynhds_free(&stream->resp_trailers);
  if(stream->push_headers) {
    /* if they weren't used and then freed before */
    for(; stream->push_headers_used > 0; --stream->push_headers_used) {
      free(stream->push_headers[stream->push_headers_used - 1]);
    }
    free(stream->push_headers);
    stream->push_headers = NULL;
  }

  free(stream);
  H2_STREAM_LCTX(data) = NULL;
}